

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCaseInstance::verify
          (LinearDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  tcu *this_00;
  float *pfVar1;
  Precision PVar2;
  DerivateCaseValues *pDVar3;
  DerivateCaseDefinition *pDVar4;
  Vec4 *pVVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  MessageBuilder *pMVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  TestContext *pTVar10;
  TestLog *pTVar11;
  undefined7 extraout_var_01;
  undefined7 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float *local_768;
  float local_75c;
  Vector<float,_4> local_750;
  undefined1 local_740 [8];
  Vec4 threshold_1;
  Vec4 local_720;
  undefined1 local_710 [8];
  Vec4 dyThreshold;
  Vec4 local_6f0;
  undefined1 local_6e0 [8];
  Vec4 dxThreshold;
  Vector<float,_4> local_6c0;
  undefined1 local_6b0 [8];
  Vec4 reference_1;
  Vector<float,_4> local_690;
  undefined1 local_680 [8];
  Vec4 dy;
  Vector<float,_4> local_660;
  undefined1 local_650 [8];
  Vec4 dx;
  float h_1;
  float w_1;
  Vector<float,_3> local_62c;
  Vector<float,_3> local_620;
  Vector<float,_3> local_614;
  Vector<float,_3> local_608;
  Vector<float,_3> local_5fc;
  undefined1 local_5f0 [8];
  Linear2DFunctionEvaluator function;
  Vec4 valueRamp;
  float h;
  float w;
  UVec2 viewportSize;
  MessageBuilder local_420;
  LogVecComps local_2a0;
  LogVecComps local_290 [2];
  MessageBuilder local_270;
  tcu local_ec [8];
  float afStack_e4 [2];
  DataType local_dc;
  undefined1 local_d8 [4];
  int numComps;
  Vec4 threshold;
  Vec4 opThreshold;
  undefined1 auStack_a8 [8];
  Vec4 reference;
  Vec4 scale;
  float div;
  bool isX;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  Vec4 surfaceThreshold;
  Vec4 yScale;
  Vec4 xScale;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *result_local;
  LinearDerivateCaseInstance *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yScale.m_data + 2),1.0,0.0,0.5,-0.5);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(surfaceThreshold.m_data + 2),0.0,1.0,0.5,-0.5);
  TriangleDerivateCaseInstance::getSurfaceThreshold((TriangleDerivateCaseInstance *)local_70);
  tcu::abs<float,4>((tcu *)&div,&((this->super_TriangleDerivateCaseInstance).m_values)->derivScale);
  tcu::operator/((tcu *)local_60,(Vector<float,_4> *)local_70,(Vector<float,_4> *)&div);
  bVar6 = isDfdxFunc(((this->super_TriangleDerivateCaseInstance).m_definitions)->func);
  if (!bVar6) {
    bVar6 = isDfdyFunc(((this->super_TriangleDerivateCaseInstance).m_definitions)->func);
    if (!bVar6) {
      iVar8 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)ctx);
      dx.m_data[3] = (float)iVar8;
      iVar8 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)ctx);
      dx.m_data[2] = (float)iVar8;
      tcu::operator-((tcu *)(dy.m_data + 2),
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMax,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMin);
      tcu::operator/((tcu *)&local_660,(Vector<float,_4> *)(dy.m_data + 2),dx.m_data[3]);
      tcu::operator*((tcu *)local_650,&local_660,(Vector<float,_4> *)(yScale.m_data + 2));
      tcu::operator-((tcu *)(reference_1.m_data + 2),
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMax,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMin);
      tcu::operator/((tcu *)&local_690,(Vector<float,_4> *)(reference_1.m_data + 2),dx.m_data[2]);
      tcu::operator*((tcu *)local_680,&local_690,(Vector<float,_4> *)(surfaceThreshold.m_data + 2));
      tcu::abs<float,4>((tcu *)&local_6c0,(Vector<float,_4> *)local_650);
      tcu::abs<float,4>((tcu *)(dxThreshold.m_data + 2),(Vector<float,_4> *)local_680);
      tcu::operator+((tcu *)local_6b0,&local_6c0,(Vector<float,_4> *)(dxThreshold.m_data + 2));
      PVar2 = ((this->super_TriangleDerivateCaseInstance).m_definitions)->precision;
      tcu::operator*((tcu *)&local_6f0,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMin,
                     (Vector<float,_4> *)(yScale.m_data + 2));
      tcu::operator*((tcu *)(dyThreshold.m_data + 2),
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMax,
                     (Vector<float,_4> *)(yScale.m_data + 2));
      getDerivateThreshold
                ((anon_unknown_0 *)local_6e0,PVar2,&local_6f0,(Vec4 *)(dyThreshold.m_data + 2),
                 (Vec4 *)local_650);
      PVar2 = ((this->super_TriangleDerivateCaseInstance).m_definitions)->precision;
      tcu::operator*((tcu *)&local_720,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMin,
                     (Vector<float,_4> *)(surfaceThreshold.m_data + 2));
      tcu::operator*((tcu *)(threshold_1.m_data + 2),
                     &((this->super_TriangleDerivateCaseInstance).m_values)->coordMax,
                     (Vector<float,_4> *)(surfaceThreshold.m_data + 2));
      getDerivateThreshold
                ((anon_unknown_0 *)local_710,PVar2,&local_720,(Vec4 *)(threshold_1.m_data + 2),
                 (Vec4 *)local_680);
      tcu::max<float,4>((tcu *)&local_750,(Vector<float,_4> *)local_6e0,
                        (Vector<float,_4> *)local_710);
      tcu::max<float,4>((tcu *)local_740,(Vector<float,_4> *)local_60,&local_750);
      pTVar10 = Context::getTestContext
                          ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance
                           .super_TestInstance.m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      this_local._7_1_ =
           verifyConstantDerivate
                     (pTVar11,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                      ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,
                      (Vec4 *)local_6b0,(Vec4 *)local_740,
                      &((this->super_TriangleDerivateCaseInstance).m_values)->derivScale,
                      &((this->super_TriangleDerivateCaseInstance).m_values)->derivBias,LOG_ALL);
      uVar12 = extraout_var_01;
      goto LAB_00a6b752;
    }
  }
  bVar6 = isDfdxFunc(((this->super_TriangleDerivateCaseInstance).m_definitions)->func);
  if (bVar6) {
    iVar8 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)ctx);
  }
  else {
    iVar8 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)ctx);
  }
  local_75c = (float)iVar8;
  if (bVar6) {
    pVVar5 = &yScale;
  }
  else {
    pVVar5 = &surfaceThreshold;
  }
  local_768 = pVVar5->m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(reference.m_data + 2),(Vector<float,_4> *)local_768);
  pDVar3 = (this->super_TriangleDerivateCaseInstance).m_values;
  tcu::operator-((tcu *)(opThreshold.m_data + 2),&pDVar3->coordMax,&pDVar3->coordMin);
  tcu::operator/((tcu *)auStack_a8,(Vector<float,_4> *)(opThreshold.m_data + 2),local_75c);
  pDVar3 = (this->super_TriangleDerivateCaseInstance).m_values;
  getDerivateThreshold
            ((anon_unknown_0 *)(threshold.m_data + 2),
             ((this->super_TriangleDerivateCaseInstance).m_definitions)->precision,&pDVar3->coordMin
             ,&pDVar3->coordMax,(Vec4 *)auStack_a8);
  tcu::max<float,4>((tcu *)local_d8,(Vector<float,_4> *)local_60,
                    (Vector<float,_4> *)(threshold.m_data + 2));
  local_dc = glu::getDataTypeFloatScalars
                       (((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType);
  tcu::operator*(local_ec,(Vector<float,_4> *)auStack_a8,(Vector<float,_4> *)(reference.m_data + 2))
  ;
  auStack_a8[0] = local_ec[0];
  auStack_a8[1] = local_ec[1];
  auStack_a8[2] = local_ec[2];
  auStack_a8[3] = local_ec[3];
  auStack_a8[4] = local_ec[4];
  auStack_a8[5] = local_ec[5];
  auStack_a8[6] = local_ec[6];
  auStack_a8[7] = local_ec[7];
  reference.m_data[0] = afStack_e4[0];
  reference.m_data[1] = afStack_e4[1];
  pTVar10 = Context::getTestContext
                      ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                       super_TestInstance.m_context);
  pTVar11 = tcu::TestContext::getLog(pTVar10);
  tcu::TestLog::operator<<(&local_270,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_270,(char (*) [25])"Verifying result image.\n");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [22])"\tValid derivative is ");
  LogVecComps::LogVecComps(local_290,(Vec4 *)auStack_a8,local_dc);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_290);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])" with threshold ");
  LogVecComps::LogVecComps(&local_2a0,(Vec4 *)local_d8,local_dc);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2a0);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_270);
  pTVar10 = Context::getTestContext
                      ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                       super_TestInstance.m_context);
  pTVar11 = tcu::TestContext::getLog(pTVar10);
  bVar6 = verifyConstantDerivate
                    (pTVar11,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                     ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,
                     (Vec4 *)auStack_a8,(Vec4 *)local_d8,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->derivScale,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->derivBias,LOG_NOTHING);
  if (bVar6) {
    pTVar10 = Context::getTestContext
                        ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                         super_TestInstance.m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    tcu::TestLog::operator<<(&local_420,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_420,(char (*) [46])"No incorrect derivatives found, result valid.");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_420);
    this_local._7_1_ = true;
    uVar12 = extraout_var;
  }
  else {
    pTVar10 = Context::getTestContext
                        ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                         super_TestInstance.m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&viewportSize,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&viewportSize,
                        (char (*) [106])
                        "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                       );
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [78])
                               "\tVerifying each result derivative is within its range of legal result values."
                       );
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&viewportSize);
    tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&h,99,0x85);
    uVar7 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&h);
    fVar13 = (float)uVar7;
    uVar7 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&h);
    fVar14 = (float)uVar7;
    pDVar3 = (this->super_TriangleDerivateCaseInstance).m_values;
    this_00 = (tcu *)(function.matrix.m_data.m_data[2].m_data + 2);
    tcu::operator-(this_00,&pDVar3->coordMax,&pDVar3->coordMin);
    Linear2DFunctionEvaluator::Linear2DFunctionEvaluator((Linear2DFunctionEvaluator *)local_5f0);
    fVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)this_00);
    fVar16 = tcu::Vector<float,_4>::x
                       (&((this->super_TriangleDerivateCaseInstance).m_values)->coordMin);
    tcu::Vector<float,_3>::Vector(&local_5fc,fVar15 / fVar13,0.0,fVar16);
    tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_5f0,0,&local_5fc);
    fVar15 = tcu::Vector<float,_4>::y
                       ((Vector<float,_4> *)(function.matrix.m_data.m_data[2].m_data + 2));
    fVar16 = tcu::Vector<float,_4>::y
                       (&((this->super_TriangleDerivateCaseInstance).m_values)->coordMin);
    tcu::Vector<float,_3>::Vector(&local_608,0.0,fVar15 / fVar14,fVar16);
    tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_5f0,1,&local_608);
    pfVar1 = function.matrix.m_data.m_data[2].m_data + 2;
    fVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar1);
    fVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar1);
    fVar17 = tcu::Vector<float,_4>::z
                       (&((this->super_TriangleDerivateCaseInstance).m_values)->coordMin);
    fVar18 = tcu::Vector<float,_4>::z
                       (&((this->super_TriangleDerivateCaseInstance).m_values)->coordMin);
    tcu::Vector<float,_3>::Vector(&local_620,fVar15 / fVar13,fVar16 / fVar14,fVar17 + fVar18);
    tcu::operator/((tcu *)&local_614,&local_620,2.0);
    tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_5f0,2,&local_614);
    pfVar1 = function.matrix.m_data.m_data[2].m_data + 2;
    fVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar1);
    fVar16 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar1);
    fVar17 = tcu::Vector<float,_4>::w
                       (&((this->super_TriangleDerivateCaseInstance).m_values)->coordMax);
    fVar18 = tcu::Vector<float,_4>::w
                       (&((this->super_TriangleDerivateCaseInstance).m_values)->coordMax);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)&h_1,-fVar15 / fVar13,-fVar16 / fVar14,fVar17 + fVar18);
    tcu::operator/((tcu *)&local_62c,(Vector<float,_3> *)&h_1,2.0);
    tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_5f0,3,&local_62c);
    pTVar10 = Context::getTestContext
                        ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                         super_TestInstance.m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    pDVar4 = (this->super_TriangleDerivateCaseInstance).m_definitions;
    pDVar3 = (this->super_TriangleDerivateCaseInstance).m_values;
    this_local._7_1_ =
         reverifyConstantDerivateWithFlushRelaxations
                   (pTVar11,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,pDVar4->dataType,
                    pDVar4->precision,&pDVar3->derivScale,&pDVar3->derivBias,(Vec4 *)local_60,
                    pDVar4->func,(Linear2DFunctionEvaluator *)local_5f0);
    Linear2DFunctionEvaluator::~Linear2DFunctionEvaluator((Linear2DFunctionEvaluator *)local_5f0);
    uVar12 = extraout_var_00;
  }
LAB_00a6b752:
  return (int)CONCAT71(uVar12,this_local._7_1_);
}

Assistant:

bool LinearDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	if (isDfdxFunc(m_definitions.func) || isDfdyFunc(m_definitions.func))
	{
		const bool			isX			= isDfdxFunc(m_definitions.func);
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		tcu::Vec4			reference	= ((m_values.coordMax - m_values.coordMin) / div);
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin, m_values.coordMax, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_definitions.dataType);

		/* adjust the reference value for the correct dfdx or dfdy sample adjacency */
		reference = reference * scale;

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								   reference, threshold, m_values.derivScale, m_values.derivBias,
								   LOG_NOTHING))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::UVec2			viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_values.coordMax - m_values.coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_values.coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_values.coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_values.coordMin.z() + m_values.coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_values.coordMax.w() + m_values.coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_context.getTestContext().getLog(), result, errorMask,
																m_definitions.dataType, m_definitions.precision, m_values.derivScale,
																m_values.derivBias, surfaceThreshold, m_definitions.func,
																function);
		}
	}
	else
	{
		DE_ASSERT(isFwidthFunc(m_definitions.func));
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_values.coordMax - m_values.coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_values.coordMax - m_values.coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*xScale, m_values.coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*yScale, m_values.coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
									  reference, threshold, m_values.derivScale, m_values.derivBias);
	}
}